

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O0

bool __thiscall SDLVideo::NextMode(SDLVideo *this,int *width,int *height,bool *letterbox)

{
  bool *letterbox_local;
  int *height_local;
  int *width_local;
  SDLVideo *this_local;
  
  if (this->IteratorBits == 8) {
    if ((uint)this->IteratorMode < 0x3e) {
      *width = (uint)WinModes[this->IteratorMode].Width;
      *height = (uint)WinModes[this->IteratorMode].Height;
      this->IteratorMode = this->IteratorMode + 1;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SDLVideo::NextMode (int *width, int *height, bool *letterbox)
{
	if (IteratorBits != 8)
		return false;

	if ((unsigned)IteratorMode < sizeof(WinModes)/sizeof(WinModes[0]))
	{
		*width = WinModes[IteratorMode].Width;
		*height = WinModes[IteratorMode].Height;
		++IteratorMode;
		return true;
	}
	return false;
}